

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

int mbedtls_des_self_test(int verbose)

{
  uchar auVar1 [8];
  uchar auVar2 [8];
  int i;
  long lVar3;
  char *pcVar4;
  uchar (*pauVar5) [8];
  int iVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uchar temp [8];
  uchar auVar10 [8];
  uchar buf [8];
  uint32_t sk [96];
  mbedtls_des_context ctx;
  mbedtls_des3_context ctx3;
  uchar local_3d8 [8];
  int local_3cc;
  uchar local_3c8 [8];
  uint local_3bc;
  uint32_t local_3b8 [96];
  mbedtls_des_context local_238;
  mbedtls_des3_context local_1b0;
  
  local_238.sk[0] = 0;
  local_238.sk[1] = 0;
  local_238.sk[2] = 0;
  local_238.sk[3] = 0;
  local_238.sk[4] = 0;
  local_238.sk[5] = 0;
  local_238.sk[6] = 0;
  local_238.sk[7] = 0;
  local_238.sk[8] = 0;
  local_238.sk[9] = 0;
  local_238.sk[10] = 0;
  local_238.sk[0xb] = 0;
  local_238.sk[0xc] = 0;
  local_238.sk[0xd] = 0;
  local_238.sk[0xe] = 0;
  local_238.sk[0xf] = 0;
  local_238.sk[0x10] = 0;
  local_238.sk[0x11] = 0;
  local_238.sk[0x12] = 0;
  local_238.sk[0x13] = 0;
  local_238.sk[0x14] = 0;
  local_238.sk[0x15] = 0;
  local_238.sk[0x16] = 0;
  local_238.sk[0x17] = 0;
  local_238.sk[0x18] = 0;
  local_238.sk[0x19] = 0;
  local_238.sk[0x1a] = 0;
  local_238.sk[0x1b] = 0;
  local_238.sk[0x1c] = 0;
  local_238.sk[0x1d] = 0;
  local_238.sk[0x1e] = 0;
  local_238.sk[0x1f] = 0;
  memset(&local_1b0,0,0x180);
  uVar8 = 0;
  local_3cc = verbose;
  do {
    if (verbose != 0) {
      uVar7 = 0x33;
      if (uVar8 < 2) {
        uVar7 = 0x20;
      }
      pcVar4 = "enc";
      if ((uVar8 & 1) == 0) {
        pcVar4 = "dec";
      }
      printf("  DES%c-ECB-%3d (%s): ",uVar7,(ulong)((uVar8 >> 1) * 0x38 + 0x38),pcVar4);
    }
    builtin_memcpy(local_3d8,"Now is t",8);
    switch(uVar8) {
    case 0:
      mbedtls_des_setkey_dec(&local_238,des3_test_keys);
      break;
    case 1:
      mbedtls_des_setkey(local_238.sk,des3_test_keys);
      break;
    case 2:
      des3_set2key(local_3b8,local_1b0.sk,des3_test_keys);
      lVar3 = 0;
      do {
        *(undefined1 *)((long)local_3b8 + lVar3) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x180);
      break;
    case 3:
      des3_set2key(local_1b0.sk,local_3b8,des3_test_keys);
      lVar3 = 0;
      do {
        *(undefined1 *)((long)local_3b8 + lVar3) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x180);
      break;
    case 4:
      des3_set3key(local_3b8,local_1b0.sk,des3_test_keys);
      lVar3 = 0;
      do {
        *(undefined1 *)((long)local_3b8 + lVar3) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x180);
      break;
    case 5:
      des3_set3key(local_1b0.sk,local_3b8,des3_test_keys);
      lVar3 = 0;
      do {
        *(undefined1 *)((long)local_3b8 + lVar3) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x180);
      break;
    default:
      goto LAB_001096eb;
    }
    iVar6 = 10000;
    do {
      if (uVar8 < 2) {
        mbedtls_des_crypt_ecb(&local_238,local_3d8,local_3d8);
      }
      else {
        mbedtls_des3_crypt_ecb(&local_1b0,local_3d8,local_3d8);
      }
      verbose = local_3cc;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    if ((uVar8 & 1) == 0) {
      pauVar5 = des3_test_ecb_dec;
    }
    else {
      pauVar5 = des3_test_ecb_enc;
    }
    if (local_3d8 != pauVar5[uVar8 >> 1]) goto joined_r0x001096b3;
    if (local_3cc != 0) {
      puts("passed");
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar8 = 0;
  do {
    uVar9 = uVar8 >> 1;
    if (verbose != 0) {
      uVar7 = 0x33;
      if (uVar8 < 2) {
        uVar7 = 0x20;
      }
      pcVar4 = "enc";
      if ((uVar8 & 1) == 0) {
        pcVar4 = "dec";
      }
      printf("  DES%c-CBC-%3d (%s): ",uVar7,(ulong)(uVar9 * 0x38 + 0x38),pcVar4);
    }
    local_3c8[0] = '\x12';
    local_3c8[1] = '4';
    local_3c8[2] = 'V';
    local_3c8[3] = 'x';
    local_3c8[4] = 0x90;
    local_3c8[5] = 0xab;
    local_3c8[6] = 0xcd;
    local_3c8[7] = 0xef;
    builtin_memcpy(local_3d8,"Now is t",8);
    local_3bc = uVar9;
    switch(uVar8) {
    case 0:
      mbedtls_des_setkey_dec(&local_238,des3_test_keys);
      break;
    case 1:
      mbedtls_des_setkey(local_238.sk,des3_test_keys);
      break;
    case 2:
      des3_set2key(local_3b8,local_1b0.sk,des3_test_keys);
      lVar3 = 0;
      do {
        *(undefined1 *)((long)local_3b8 + lVar3) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x180);
      break;
    case 3:
      des3_set2key(local_1b0.sk,local_3b8,des3_test_keys);
      lVar3 = 0;
      do {
        *(undefined1 *)((long)local_3b8 + lVar3) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x180);
      break;
    case 4:
      des3_set3key(local_3b8,local_1b0.sk,des3_test_keys);
      lVar3 = 0;
      do {
        *(undefined1 *)((long)local_3b8 + lVar3) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x180);
      break;
    case 5:
      des3_set3key(local_1b0.sk,local_3b8,des3_test_keys);
      lVar3 = 0;
      do {
        *(undefined1 *)((long)local_3b8 + lVar3) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x180);
      break;
    default:
LAB_001096eb:
      return 1;
    }
    iVar6 = 0;
    auVar2 = local_3c8;
    if ((uVar8 & 1) == 0) {
      do {
        local_3c8 = auVar2;
        auVar10 = local_3d8;
        auVar2[0] = local_3d8[0];
        auVar2[1] = local_3d8[1];
        auVar2[2] = local_3d8[2];
        auVar2[3] = local_3d8[3];
        auVar2[4] = local_3d8[4];
        auVar2[5] = local_3d8[5];
        auVar2[6] = local_3d8[6];
        auVar2[7] = local_3d8[7];
        if (uVar8 < 2) {
          mbedtls_des_crypt_ecb(&local_238,local_3d8,local_3d8);
          lVar3 = 0;
          do {
            local_3d8[lVar3] = local_3d8[lVar3] ^ local_3c8[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 8);
        }
        else {
          mbedtls_des3_crypt_ecb(&local_1b0,local_3d8,local_3d8);
          lVar3 = 0;
          do {
            local_3d8[lVar3] = local_3d8[lVar3] ^ local_3c8[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 8);
        }
        auVar1 = local_3d8;
        local_3d8[0] = auVar10[0];
        local_3d8[1] = auVar10[1];
        local_3d8[2] = auVar10[2];
        local_3d8[3] = auVar10[3];
        local_3d8[4] = auVar10[4];
        local_3d8[5] = auVar10[5];
        local_3d8[6] = auVar10[6];
        local_3d8[7] = auVar10[7];
        local_3c8[0] = local_3d8[0];
        local_3c8[1] = local_3d8[1];
        local_3c8[2] = local_3d8[2];
        local_3c8[3] = local_3d8[3];
        local_3c8[4] = local_3d8[4];
        local_3c8[5] = local_3d8[5];
        local_3c8[6] = local_3d8[6];
        local_3c8[7] = local_3d8[7];
        iVar6 = iVar6 + 1;
        local_3d8 = auVar1;
      } while (iVar6 != 10000);
    }
    else {
      auVar10[0] = '\x12';
      auVar10[1] = '4';
      auVar10[2] = 'V';
      auVar10[3] = 'x';
      auVar10[4] = 0x90;
      auVar10[5] = 0xab;
      auVar10[6] = 0xcd;
      auVar10[7] = 0xef;
      do {
        lVar3 = 0;
        if (uVar8 < 2) {
          do {
            local_3d8[lVar3] = local_3d8[lVar3] ^ local_3c8[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 8);
          mbedtls_des_crypt_ecb(&local_238,local_3d8,local_3d8);
        }
        else {
          do {
            local_3d8[lVar3] = local_3d8[lVar3] ^ local_3c8[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 8);
          mbedtls_des3_crypt_ecb(&local_1b0,local_3d8,local_3d8);
        }
        auVar1 = local_3d8;
        local_3c8[0] = local_3d8[0];
        local_3c8[1] = local_3d8[1];
        local_3c8[2] = local_3d8[2];
        local_3c8[3] = local_3d8[3];
        local_3c8[4] = local_3d8[4];
        local_3c8[5] = local_3d8[5];
        local_3c8[6] = local_3d8[6];
        local_3c8[7] = local_3d8[7];
        local_3d8[0] = auVar10[0];
        local_3d8[1] = auVar10[1];
        local_3d8[2] = auVar10[2];
        local_3d8[3] = auVar10[3];
        local_3d8[4] = auVar10[4];
        local_3d8[5] = auVar10[5];
        local_3d8[6] = auVar10[6];
        local_3d8[7] = auVar10[7];
        iVar6 = iVar6 + 1;
        auVar10 = auVar1;
      } while (iVar6 != 10000);
    }
    local_3d8 = auVar1;
    verbose = local_3cc;
    if ((uVar8 & 1) == 0) {
      if (local_3d8 != des3_test_cbc_dec[local_3bc]) goto joined_r0x001096b3;
      if ((uVar8 & 1) != 0) goto LAB_00109666;
    }
    else {
LAB_00109666:
      if (local_3d8 != des3_test_cbc_enc[local_3bc]) goto joined_r0x001096b3;
    }
    if (local_3cc != 0) {
      puts("passed");
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 6);
  iVar6 = 0;
  if (verbose != 0) {
    putchar(10);
  }
LAB_001096c1:
  lVar3 = 0;
  do {
    *(undefined1 *)((long)local_238.sk + lVar3) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  lVar3 = 0;
  do {
    *(undefined1 *)((long)local_1b0.sk + lVar3) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x180);
  return iVar6;
joined_r0x001096b3:
  iVar6 = 1;
  if (local_3cc != 0) {
    iVar6 = 1;
    puts("failed");
  }
  goto LAB_001096c1;
}

Assistant:

int mbedtls_des_self_test( int verbose )
{
    int i, j, u, v, ret = 0;
    mbedtls_des_context ctx;
    mbedtls_des3_context ctx3;
    unsigned char buf[8];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[8];
    unsigned char iv[8];
#endif

    mbedtls_des_init( &ctx );
    mbedtls_des3_init( &ctx3 );
    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-ECB-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        for( j = 0; j < 10000; j++ )
        {
            if( u == 0 )
                mbedtls_des_crypt_ecb( &ctx, buf, buf );
            else
                mbedtls_des3_crypt_ecb( &ctx3, buf, buf );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-CBC-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  des3_test_iv,  8 );
        memcpy( prv, des3_test_iv,  8 );
        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        if( v == MBEDTLS_DES_DECRYPT )
        {
            for( j = 0; j < 10000; j++ )
            {
                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );
            }
        }
        else
        {
            for( j = 0; j < 10000; j++ )
            {
                unsigned char tmp[8];

                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );

                memcpy( tmp, prv, 8 );
                memcpy( prv, buf, 8 );
                memcpy( buf, tmp, 8 );
            }

            memcpy( buf, prv, 8 );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_des_free( &ctx );
    mbedtls_des3_free( &ctx3 );

    return( ret );
}